

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Maybe<kj::Own<const_kj::Directory>_> __thiscall
kj::anon_unknown_8::DiskDirectory::tryOpenSubdir(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  bool bVar1;
  undefined4 in_register_0000000c;
  Directory *extraout_RDX;
  Directory *pDVar2;
  Directory *extraout_RDX_00;
  WriteMode in_R8D;
  size_t *this_00;
  PathPtr path_00;
  Maybe<kj::Own<kj::Directory>_> MVar3;
  Maybe<kj::Own<const_kj::Directory>_> MVar4;
  PathPtr path_01;
  Maybe<kj::AutoCloseFd> local_44;
  _func_int **local_38;
  AutoCloseFd AStack_30;
  
  path_01.parts.size_ = CONCAT44(in_register_0000000c,mode);
  path_01.parts.ptr = (String *)path.parts.size_;
  this_00 = &((path.parts.ptr)->content).size_;
  if ((in_R8D & CREATE) != 0) {
    path_00.parts.size_ = path_01.parts.size_;
    path_00.parts.ptr = path_01.parts.ptr;
    bVar1 = DiskHandle::tryMkdir((DiskHandle *)this_00,path_00,in_R8D,false);
    if (!bVar1) {
      (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = (_func_int **)0x0;
      (this->super_DiskHandle).fd = (AutoCloseFd)0x0;
      pDVar2 = extraout_RDX;
      goto LAB_004a2b6b;
    }
  }
  DiskHandle::tryOpenSubdirInternal(&local_44,(DiskHandle *)this_00,path_01);
  MVar3 = Maybe<kj::AutoCloseFd>::map<kj::Own<kj::Directory>_(&)(kj::AutoCloseFd)>
                    ((Maybe<kj::AutoCloseFd> *)&local_38,
                     (_func_Own<kj::Directory>_AutoCloseFd *)&local_44);
  pDVar2 = MVar3.ptr.ptr;
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = local_38;
  (this->super_DiskHandle).fd = AStack_30;
  AStack_30.fd = 0;
  AStack_30.unwindDetector.uncaughtCount = 0;
  if (local_44.ptr.isSet == true) {
    AutoCloseFd::~AutoCloseFd(&local_44.ptr.field_1.value);
    pDVar2 = extraout_RDX_00;
  }
LAB_004a2b6b:
  MVar4.ptr.ptr = pDVar2;
  MVar4.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::Directory>_>)MVar4.ptr;
}

Assistant:

Maybe<Own<const Directory>> tryOpenSubdir(PathPtr path, WriteMode mode) const override {
    return DiskHandle::tryOpenSubdir(path, mode);
  }